

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decaf.c
# Opt level: O0

void sub_niels_from_pt(decaf_448_point_s *d,niels_s *e,int before_double)

{
  word_t wVar1;
  word_t wVar2;
  int in_EDX;
  gf_448_s *in_RDI;
  gf_448_t c;
  gf_448_t b;
  gf_448_t a;
  uint i_2;
  uint i_1;
  uint i;
  long alStack_180 [8];
  gf_448_s local_140;
  gf_448_s local_100;
  int local_a4;
  gf_448_s *local_98;
  uint local_8c;
  gf_448_s *local_88;
  gf_448_s *local_80;
  gf_448_s *local_78;
  uint local_6c;
  gf_448_s *local_68;
  gf_448_s *local_60;
  undefined1 *local_58;
  uint local_4c;
  gf_448_s *local_48;
  gf_448_s *local_40;
  gf_448_s *local_38;
  
  local_a4 = in_EDX;
  local_98 = in_RDI;
  gf_sub_nr(&local_140,in_RDI + 1,in_RDI);
  gf_448_mul((gf_448_s *)c[0].limb[3],(gf_448_s *)c[0].limb[2],(gf_448_s *)c[0].limb[1]);
  local_38 = &local_140;
  local_48 = local_98 + 1;
  local_40 = local_98;
  for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
    wVar1 = (local_98->limb + (ulong)local_4c * 2)[1];
    wVar2 = (local_48->limb + (ulong)local_4c * 2)[1];
    local_38->limb[(ulong)local_4c * 2] =
         local_98->limb[(ulong)local_4c * 2] + local_48->limb[(ulong)local_4c * 2];
    local_140.limb[(ulong)local_4c * 2 + 1] = wVar1 + wVar2;
  }
  gf_448_mul((gf_448_s *)c[0].limb[3],(gf_448_s *)c[0].limb[2],(gf_448_s *)c[0].limb[1]);
  gf_448_mul((gf_448_s *)c[0].limb[3],(gf_448_s *)c[0].limb[2],(gf_448_s *)c[0].limb[1]);
  local_60 = &local_100;
  local_68 = local_98 + 1;
  for (local_6c = 0; local_6c < 4; local_6c = local_6c + 1) {
    wVar1 = local_100.limb[(ulong)local_6c * 2 + 1];
    wVar2 = (local_68->limb + (ulong)local_6c * 2)[1];
    alStack_180[(ulong)local_6c * 2] =
         local_60->limb[(ulong)local_6c * 2] + local_68->limb[(ulong)local_6c * 2];
    alStack_180[(ulong)local_6c * 2 + 1] = wVar1 + wVar2;
  }
  local_58 = (undefined1 *)alStack_180;
  gf_sub_nr(&local_140,local_98 + 1,&local_100);
  local_78 = local_98 + 1;
  local_80 = local_98 + 2;
  local_88 = local_98;
  for (local_8c = 0; local_8c < 4; local_8c = local_8c + 1) {
    wVar1 = (local_80->limb + (ulong)local_8c * 2)[1];
    wVar2 = (local_98->limb + (ulong)local_8c * 2)[1];
    local_78->limb[(ulong)local_8c * 2] =
         local_80->limb[(ulong)local_8c * 2] + local_98->limb[(ulong)local_8c * 2];
    (local_78->limb + (ulong)local_8c * 2)[1] = wVar1 + wVar2;
  }
  gf_sub_nr(&local_100,local_98 + 2,local_98);
  gf_448_mul((gf_448_s *)c[0].limb[3],(gf_448_s *)c[0].limb[2],(gf_448_s *)c[0].limb[1]);
  gf_448_mul((gf_448_s *)c[0].limb[3],(gf_448_s *)c[0].limb[2],(gf_448_s *)c[0].limb[1]);
  gf_448_mul((gf_448_s *)c[0].limb[3],(gf_448_s *)c[0].limb[2],(gf_448_s *)c[0].limb[1]);
  if (local_a4 == 0) {
    gf_448_mul((gf_448_s *)c[0].limb[3],(gf_448_s *)c[0].limb[2],(gf_448_s *)c[0].limb[1]);
  }
  return;
}

Assistant:

static DECAF_NOINLINE void
sub_niels_from_pt (
    point_t d,
    const niels_t e,
    int before_double
) {
    gf a, b, c;
    gf_sub_nr ( b, d->y, d->x ); /* 3+e */
    gf_mul ( a, e->b, b );
    gf_add_nr ( b, d->x, d->y ); /* 2+e */
    gf_mul ( d->y, e->a, b );
    gf_mul ( d->x, e->c, d->t );
    gf_add_nr ( c, a, d->y );    /* 2+e */
    gf_sub_nr ( b, d->y, a );    /* 3+e */
    gf_add_nr ( d->y, d->z, d->x ); /* 2+e */
    gf_sub_nr ( a, d->z, d->x ); /* 3+e */
    gf_mul ( d->z, a, d->y );
    gf_mul ( d->x, d->y, b );
    gf_mul ( d->y, a, c );
    if (!before_double) gf_mul ( d->t, b, c );
}